

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerReflection::emit_types(CompilerReflection *this)

{
  uint *puVar1;
  element_type *this_00;
  uint32_t pointee_type;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  anon_class_24_3_2fafcee3 local_68;
  undefined1 local_50 [8];
  SmallVector<unsigned_int,_8UL> physical_pointee_types;
  bool emitted_open_tag;
  CompilerReflection *this_local;
  
  physical_pointee_types.stack_storage.aligned_char[0x1f] = '\0';
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_50);
  local_68.emitted_open_tag = (bool *)(physical_pointee_types.stack_storage.aligned_char + 0x1f);
  local_68.this = this;
  local_68.physical_pointee_types = (SmallVector<unsigned_int,_8UL> *)local_50;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerReflection::emit_types()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_68);
  __end1 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)local_50);
  puVar1 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_50);
  for (; __end1 != puVar1; __end1 = __end1 + 1) {
    emit_type(this,*__end1,(bool *)(physical_pointee_types.stack_storage.aligned_char + 0x1f));
  }
  if ((physical_pointee_types.stack_storage.aligned_char[0x1f] & 1U) != 0) {
    this_00 = ::std::
              __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->json_stream);
    simple_json::Stream::end_json_object(this_00);
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_50);
  return;
}

Assistant:

void CompilerReflection::emit_types()
{
	bool emitted_open_tag = false;

	SmallVector<uint32_t> physical_pointee_types;

	// If we have physical pointers or arrays of physical pointers, it's also helpful to emit the pointee type
	// and chain the type hierarchy. For POD, arrays can emit the entire type in-place.
	ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
		if (naturally_emit_type(type))
		{
			emit_type(self, emitted_open_tag);
		}
		else if (type_is_reference(type))
		{
			if (!naturally_emit_type(this->get<SPIRType>(type.parent_type)) &&
			    find(physical_pointee_types.begin(), physical_pointee_types.end(), type.parent_type) ==
			        physical_pointee_types.end())
			{
				physical_pointee_types.push_back(type.parent_type);
			}
		}
	});

	for (uint32_t pointee_type : physical_pointee_types)
		emit_type(pointee_type, emitted_open_tag);

	if (emitted_open_tag)
	{
		json_stream->end_json_object();
	}
}